

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetResourceDimString(RESOURCE_DIMENSION TexType)

{
  int iVar1;
  Char *pCVar2;
  RESOURCE_DIMENSION TexType_local;
  
  if (GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings)
    ;
    if (iVar1 != 0) {
      GetResourceDimString::ResourceDimToStringMap::ResourceDimToStringMap
                (&GetResourceDimString::TexTypeStrings);
      __cxa_guard_release(&GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings);
    }
  }
  pCVar2 = GetResourceDimString(Diligent::RESOURCE_DIMENSION)::ResourceDimToStringMap::
           operator[](Diligent::RESOURCE_DIMENSION__const
                     (&GetResourceDimString::TexTypeStrings,TexType);
  return pCVar2;
}

Assistant:

const Char* GetResourceDimString(RESOURCE_DIMENSION TexType)
{
    struct ResourceDimToStringMap
    {
        ResourceDimToStringMap()
        {
            TexTypeStrings[RESOURCE_DIM_UNDEFINED]      = "Undefined";
            TexTypeStrings[RESOURCE_DIM_BUFFER]         = "Buffer";
            TexTypeStrings[RESOURCE_DIM_TEX_1D]         = "Texture 1D";
            TexTypeStrings[RESOURCE_DIM_TEX_1D_ARRAY]   = "Texture 1D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_2D]         = "Texture 2D";
            TexTypeStrings[RESOURCE_DIM_TEX_2D_ARRAY]   = "Texture 2D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_3D]         = "Texture 3D";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE]       = "Texture Cube";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE_ARRAY] = "Texture Cube Array";
            static_assert(RESOURCE_DIM_NUM_DIMENSIONS == 9, "Not all texture type strings initialized.");
        }

        const Char* operator[](RESOURCE_DIMENSION TexType) const
        {
            if (TexType >= RESOURCE_DIM_UNDEFINED && TexType < RESOURCE_DIM_NUM_DIMENSIONS)
                return TexTypeStrings[TexType];
            else
            {
                UNEXPECTED("Unknown texture type");
                return "Unknown texture type";
            }
        }

    private:
        std::array<const Char*, RESOURCE_DIM_NUM_DIMENSIONS> TexTypeStrings{};
    };

    static const ResourceDimToStringMap TexTypeStrings;
    return TexTypeStrings[TexType];
}